

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall
Js::InterpreterStackFrame::
OP_ProfiledLdInnerSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
          (InterpreterStackFrame *this,Var slotArray,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  UnsignedType UVar1;
  long lVar2;
  Var value;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  undefined4 *puVar5;
  
  UVar1 = (playout->super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
          SlotIndex2;
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  lVar2 = *(long *)(this + 0x88);
  if (*(long *)(lVar2 + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,ClosureRangeCheckPhase,sourceContextId,
                            *(LocalFunctionId *)(*(long *)(lVar2 + 0x10) + 0x10));
  if ((!bVar4) && (*slotArray <= (ulong)(UVar1 - 2))) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  value = *(Var *)((long)slotArray + (long)(int)UVar1 * 8);
  ProfilingHelpers::ProfileLdSlot(value,*(FunctionBody **)(this + 0x88),playout->profileId);
  return value;
}

Assistant:

Var InterpreterStackFrame::OP_ProfiledLdInnerSlot(Var slotArray, const unaligned T* playout)
    {
        Var value = OP_LdInnerSlot(slotArray, playout);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }